

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

string * __thiscall
AlignmentRecord::getReferenceSeq1_abi_cxx11_(string *__return_storage_ptr__,AlignmentRecord *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->reference_seq1);
  return __return_storage_ptr__;
}

Assistant:

std::string AlignmentRecord::getReferenceSeq1() const{
    return this->reference_seq1;
}